

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::DatabaseBackedPoolTest_FindFileContainingSymbol_Test::
~DatabaseBackedPoolTest_FindFileContainingSymbol_Test
          (DatabaseBackedPoolTest_FindFileContainingSymbol_Test *this)

{
  DatabaseBackedPoolTest::~DatabaseBackedPoolTest(&this->super_DatabaseBackedPoolTest);
  operator_delete(this,0x78);
  return;
}

Assistant:

TEST_F(DatabaseBackedPoolTest, FindFileContainingSymbol) {
  DescriptorPool pool(&database_);

  const FileDescriptor* file = pool.FindFileContainingSymbol("Foo");
  ASSERT_TRUE(file != nullptr);
  EXPECT_EQ("foo.proto", file->name());
  EXPECT_EQ(file, pool.FindFileByName("foo.proto"));

  EXPECT_TRUE(pool.FindFileContainingSymbol("NoSuchSymbol") == nullptr);
}